

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_migrate.c
# Opt level: O1

REF_STATUS
ref_migrate_native_rcb_direction
          (REF_MPI ref_mpi,REF_INT n,REF_DBL *xyz,REF_DBL *transform,REF_INT npart,REF_INT offset,
          REF_INT *owners,REF_INT *locals,REF_MPI global_mpi,REF_INT *part,REF_INT seed,REF_INT dir,
          REF_BOOL twod)

{
  undefined8 *puVar1;
  double dVar2;
  bool bVar3;
  REF_INT RVar4;
  uint uVar5;
  void *pvVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  undefined8 uVar10;
  int last_rank;
  int first_rank;
  double *pdVar11;
  long lVar12;
  undefined8 *puVar13;
  char *pcVar14;
  int nitem;
  int nitem_00;
  REF_MPI pRVar15;
  ulong uVar16;
  REF_DBL *x;
  size_t sVar17;
  undefined4 uVar18;
  REF_BOOL in_stack_fffffffffffffeb8;
  uint local_13c;
  REF_INT bal_n1;
  void *local_110;
  double *local_108;
  REF_DBL *bal_xyz1;
  REF_DBL *local_f8;
  REF_INT *bal_owners0;
  undefined1 local_e8 [16];
  void *local_d8;
  void *local_d0;
  REF_INT *local_c8;
  REF_INT *local_c0;
  ulong local_b8;
  REF_DBL *local_b0;
  REF_MPI split_mpi;
  REF_INT bal_n0;
  void *local_98;
  ulong uStack_90;
  void *local_88;
  undefined8 uStack_80;
  REF_LONG total;
  REF_INT *bal_locals1;
  REF_INT *bal_locals0;
  REF_INT *bal_owners1;
  REF_DBL *bal_xyz0;
  REF_DBL value1;
  REF_DBL value0;
  
  RVar4 = dir;
  if (npart == 0) {
    return 0;
  }
  uVar9 = (ulong)(uint)n;
  if (npart != 1) {
    if (n < 0) {
      pcVar14 = "malloc x of REF_DBL negative";
      uVar10 = 0x1ab;
LAB_00224a0b:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
             uVar10,"ref_migrate_native_rcb_direction",pcVar14);
      return 1;
    }
    local_c8 = owners;
    local_c0 = locals;
    local_f8 = xyz;
    local_b8 = uVar9;
    local_108 = (double *)malloc(uVar9 * 8);
    if (local_108 == (double *)0x0) {
      pcVar14 = "malloc x of REF_DBL NULL";
      uVar10 = 0x1ab;
      goto LAB_002249db;
    }
    pRVar15 = ref_mpi;
    if (2 < (uint)RVar4) {
      uVar5 = ref_migrate_split_dir(ref_mpi,n,local_f8,transform,&dir);
      pRVar15 = (REF_MPI)(ulong)uVar5;
      if (uVar5 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
               0x1ad,"ref_migrate_native_rcb_direction",pRVar15,"dir");
        return uVar5;
      }
    }
    local_13c = (uint)pRVar15;
    uVar7 = (ulong)(uint)dir;
    if (2 < uVar7) {
      pcVar14 = "3D dir";
      uVar10 = 0x1ae;
      goto LAB_00224a0b;
    }
    first_rank = npart / 2;
    local_110 = (void *)(double)npart;
    local_88 = (void *)((double)local_110 * 1e+20);
    if ((double)local_88 <= -(double)local_88) {
      local_88 = (void *)-(double)local_88;
    }
    uVar18 = 0;
    local_98 = (void *)(double)first_rank;
    uStack_90 = 0;
    pvVar6 = local_98;
    if (npart < 2) {
      pvVar6 = (void *)-(double)local_98;
      uVar18 = 0x80000000;
    }
    local_e8._8_4_ = 0;
    local_e8._0_8_ = pvVar6;
    local_e8._12_4_ = uVar18;
    uStack_80 = 0;
    if ((double)local_88 <= (double)pvVar6) {
      local_13c = 4;
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
             0x1af,"ref_migrate_native_rcb_direction",4,"ratio");
      pvVar6 = (void *)local_e8._0_8_;
    }
    if ((double)local_88 <= (double)pvVar6) {
      return local_13c;
    }
    local_b0 = transform;
    if (n != 0) {
      uVar8 = 1;
      if (1 < n) {
        uVar8 = uVar9;
      }
      uVar16 = 0;
      x = local_f8;
      do {
        uVar5 = ref_matrix_ax(3,local_b0,x,(REF_DBL *)&bal_xyz0);
        if (uVar5 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                 ,0x1b6,"ref_migrate_native_rcb_direction",(ulong)uVar5,"ax");
          return uVar5;
        }
        local_108[uVar16] = (double)(&bal_xyz0)[uVar7];
        uVar16 = uVar16 + 1;
        x = x + 3;
      } while (uVar8 != uVar16);
    }
    total = local_b8;
    uVar5 = ref_mpi_allsum(ref_mpi,&total,1,2);
    if (uVar5 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
             0x1bb,"ref_migrate_native_rcb_direction",(ulong)uVar5,"high_pos");
      return uVar5;
    }
    dVar2 = (double)(-(ulong)((double)local_e8._0_8_ < (double)local_88) &
                    (ulong)((double)local_98 / (double)local_110));
    uVar7 = local_e8._8_8_ & uStack_90;
    local_e8._8_4_ = (int)uVar7;
    local_e8._0_8_ = dVar2;
    local_e8._12_4_ = (int)(uVar7 >> 0x20);
    dVar2 = ((double)(seed % 3) / 3.0) * dVar2;
    uVar5 = ref_search_selection(ref_mpi,n,local_108,(long)((double)total * dVar2),&value0);
    if (uVar5 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
             0x1be,"ref_migrate_native_rcb_direction",(ulong)uVar5,"target");
      return uVar5;
    }
    uVar5 = ref_search_selection
                      (ref_mpi,n,local_108,
                       (long)((double)total * ((dVar2 - (double)local_e8._0_8_) + 1.0)),&value1);
    if (uVar5 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
             0x1c0,"ref_migrate_native_rcb_direction",(ulong)uVar5,"target");
      return uVar5;
    }
    sVar17 = (ulong)(uint)(n * 3) << 3;
    pvVar6 = malloc(sVar17);
    if (pvVar6 == (void *)0x0) {
      pcVar14 = "malloc xyz0 of REF_DBL NULL";
      uVar10 = 0x1c2;
LAB_002249db:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
             uVar10,"ref_migrate_native_rcb_direction",pcVar14);
      return 2;
    }
    local_98 = pvVar6;
    pvVar6 = malloc(sVar17);
    if (pvVar6 == (void *)0x0) {
      pcVar14 = "malloc xyz1 of REF_DBL NULL";
      uVar10 = 0x1c3;
      goto LAB_002249db;
    }
    sVar17 = local_b8 * 4;
    local_d0 = pvVar6;
    local_d8 = malloc(sVar17);
    if (local_d8 == (void *)0x0) {
      pcVar14 = "malloc owners0 of REF_INT NULL";
      uVar10 = 0x1c4;
      goto LAB_002249db;
    }
    pvVar6 = malloc(sVar17);
    local_e8._0_8_ = pvVar6;
    if (pvVar6 == (void *)0x0) {
      pcVar14 = "malloc owners1 of REF_INT NULL";
      uVar10 = 0x1c5;
      goto LAB_002249db;
    }
    local_88 = malloc(sVar17);
    if (local_88 == (void *)0x0) {
      pcVar14 = "malloc locals0 of REF_INT NULL";
      uVar10 = 0x1c6;
      goto LAB_002249db;
    }
    local_110 = malloc(sVar17);
    if (local_110 == (void *)0x0) {
      pcVar14 = "malloc locals1 of REF_INT NULL";
      uVar10 = 0x1c7;
      local_110 = (void *)0x0;
      goto LAB_002249db;
    }
    if (n == 0) {
      nitem = 0;
      nitem_00 = 0;
    }
    else {
      uVar7 = 1;
      if (1 < n) {
        uVar7 = uVar9;
      }
      uVar9 = 0;
      nitem_00 = 0;
      nitem = 0;
      pdVar11 = local_108;
      do {
        puVar13 = (undefined8 *)((uVar9 & 0x7fffffff8) + (long)local_f8);
        if ((*pdVar11 < value0) || (value1 < *pdVar11)) {
          *(undefined8 *)((long)local_98 + (long)(nitem_00 * 3) * 8 + 0x10) = puVar13[2];
          uVar10 = puVar13[1];
          puVar1 = (undefined8 *)((long)local_98 + (long)(nitem_00 * 3) * 8);
          *puVar1 = *puVar13;
          puVar1[1] = uVar10;
          *(REF_INT *)((long)local_d8 + (long)nitem_00 * 4) = *local_c8;
          *(REF_INT *)((long)local_88 + (long)nitem_00 * 4) = *local_c0;
          nitem_00 = nitem_00 + 1;
        }
        else {
          *(undefined8 *)((long)local_d0 + (long)(nitem * 3) * 8 + 0x10) = puVar13[2];
          uVar10 = puVar13[1];
          puVar1 = (undefined8 *)((long)local_d0 + (long)(nitem * 3) * 8);
          *puVar1 = *puVar13;
          puVar1[1] = uVar10;
          *(REF_INT *)(local_e8._0_8_ + (long)nitem * 4) = *local_c8;
          *(REF_INT *)((long)local_110 + (long)nitem * 4) = *local_c0;
          nitem = nitem + 1;
        }
        uVar9 = uVar9 + 0x18;
        local_c0 = local_c0 + 1;
        local_c8 = local_c8 + 1;
        pdVar11 = pdVar11 + 1;
      } while (uVar7 * 0x18 != uVar9);
    }
    if (nitem_00 + nitem != n) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
             0x1d8,"ref_migrate_native_rcb_direction","conservation",local_b8,
             (long)(nitem_00 + nitem));
      return 1;
    }
    last_rank = first_rank + -1;
    uVar5 = ref_mpi_balance(ref_mpi,3,nitem_00,local_98,0,last_rank,&bal_n0,&bal_xyz0,3);
    if (uVar5 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
             0x1e0,"ref_migrate_native_rcb_direction",(ulong)uVar5,"split 0");
      return uVar5;
    }
    uVar5 = ref_mpi_balance(ref_mpi,3,nitem,local_d0,first_rank,ref_mpi->n + -1,&bal_n1,&bal_xyz1,3)
    ;
    if (uVar5 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
             0x1e4,"ref_migrate_native_rcb_direction",(ulong)uVar5,"split 1");
      return uVar5;
    }
    uVar5 = ref_mpi_balance(ref_mpi,1,nitem_00,local_d8,0,last_rank,&bal_n0,&bal_owners0,1);
    if (uVar5 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
             0x1e8,"ref_migrate_native_rcb_direction",(ulong)uVar5,"split owner 0");
      return uVar5;
    }
    uVar5 = ref_mpi_balance(ref_mpi,1,nitem,(void *)local_e8._0_8_,first_rank,ref_mpi->n + -1,
                            &bal_n1,&bal_owners1,1);
    if (uVar5 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
             0x1ec,"ref_migrate_native_rcb_direction",(ulong)uVar5,"split owner 1");
      return uVar5;
    }
    uVar5 = ref_mpi_balance(ref_mpi,1,nitem_00,local_88,0,last_rank,&bal_n0,&bal_locals0,1);
    if (uVar5 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
             0x1f0,"ref_migrate_native_rcb_direction",(ulong)uVar5,"split local 0");
      return uVar5;
    }
    uVar5 = ref_mpi_balance(ref_mpi,1,nitem,local_110,first_rank,ref_mpi->n + -1,&bal_n1,
                            &bal_locals1,1);
    if (uVar5 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",500
             ,"ref_migrate_native_rcb_direction",(ulong)uVar5,"split local 1");
      return uVar5;
    }
    uVar5 = ref_mpi_front_comm(ref_mpi,&split_mpi,first_rank);
    if (uVar5 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
             0x1f6,"ref_migrate_native_rcb_direction",(ulong)uVar5,"split");
      return uVar5;
    }
    dir = -1;
    if (ref_mpi->id < first_rank) {
      uVar5 = ref_migrate_native_rcb_direction
                        (split_mpi,bal_n0,bal_xyz0,local_b0,first_rank,offset,
                         (REF_INT *)CONCAT44(bal_owners0._4_4_,(int)bal_owners0),bal_locals0,
                         global_mpi,part,seed,-1,in_stack_fffffffffffffeb8);
      if (uVar5 == 0) goto LAB_00224fcd;
      pcVar14 = "recurse 0";
      uVar10 = 0x203;
    }
    else {
      uVar5 = ref_migrate_native_rcb_direction
                        (split_mpi,bal_n1,bal_xyz1,local_b0,npart - first_rank,offset + first_rank,
                         bal_owners1,bal_locals1,global_mpi,part,seed,-1,in_stack_fffffffffffffeb8);
      if (uVar5 == 0) goto LAB_00224fcd;
      pcVar14 = "recurse 1";
      uVar10 = 0x208;
    }
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
           uVar10,"ref_migrate_native_rcb_direction",(ulong)uVar5,pcVar14);
    local_13c = uVar5;
LAB_00224fcd:
    if (uVar5 != 0) {
      return local_13c;
    }
    uVar5 = ref_mpi_join_comm(split_mpi);
    if (uVar5 == 0) {
      uVar5 = ref_mpi_free(split_mpi);
      if (uVar5 == 0) {
        if (bal_locals1 != (REF_INT *)0x0) {
          free(bal_locals1);
        }
        if (bal_locals0 != (REF_INT *)0x0) {
          free(bal_locals0);
        }
        if (bal_owners1 != (REF_INT *)0x0) {
          free(bal_owners1);
        }
        if ((void *)CONCAT44(bal_owners0._4_4_,(int)bal_owners0) != (void *)0x0) {
          free((void *)CONCAT44(bal_owners0._4_4_,(int)bal_owners0));
        }
        if (bal_xyz1 != (REF_DBL *)0x0) {
          free(bal_xyz1);
        }
        if (bal_xyz0 != (REF_DBL *)0x0) {
          free(bal_xyz0);
        }
        free(local_110);
        free(local_88);
        free((void *)local_e8._0_8_);
        free(local_d8);
        free(local_d0);
        free(local_98);
        free(local_108);
        return 0;
      }
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
             0x20c,"ref_migrate_native_rcb_direction",(ulong)uVar5,"new free");
      return uVar5;
    }
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",0x20b
           ,"ref_migrate_native_rcb_direction",(ulong)uVar5,"join");
    return uVar5;
  }
  if (n < 0) {
    uVar5 = 1;
    pcVar14 = "malloc my_id of REF_INT negative";
  }
  else {
    pvVar6 = malloc(uVar9 * 4);
    if (pvVar6 != (void *)0x0) {
      bVar3 = true;
      uVar5 = n;
      if (n != 0) {
        uVar7 = 0;
        do {
          *(REF_INT *)((long)pvVar6 + uVar7 * 4) = offset;
          uVar7 = uVar7 + 1;
        } while (uVar9 != uVar7);
      }
      goto LAB_00224871;
    }
    uVar5 = 2;
    pcVar14 = "malloc my_id of REF_INT NULL";
  }
  pvVar6 = (void *)0x0;
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",0x19d,
         "ref_migrate_native_rcb_direction",pcVar14);
  bVar3 = false;
LAB_00224871:
  if (bVar3) {
    uVar5 = ref_mpi_blindsend(global_mpi,owners,pvVar6,1,n,&bal_xyz0,(REF_INT *)&bal_owners0,1);
    if (uVar5 == 0) {
      uVar5 = ref_mpi_blindsend(global_mpi,owners,locals,1,n,&bal_xyz1,(REF_INT *)&bal_owners0,1);
      if (uVar5 == 0) {
        if (0 < (long)(int)bal_owners0) {
          lVar12 = 0;
          do {
            part[*(int *)((long)bal_xyz1 + lVar12 * 4)] = *(REF_INT *)((long)bal_xyz0 + lVar12 * 4);
            lVar12 = lVar12 + 1;
          } while ((int)bal_owners0 != lVar12);
        }
        if (bal_xyz0 != (REF_DBL *)0x0) {
          free(bal_xyz0);
        }
        if (bal_xyz1 != (REF_DBL *)0x0) {
          free(bal_xyz1);
        }
        uVar5 = 0;
        if (pvVar6 != (void *)0x0) {
          free(pvVar6);
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
               0x1a3,"ref_migrate_native_rcb_direction",(ulong)uVar5,"recv loc");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
             0x1a0,"ref_migrate_native_rcb_direction",(ulong)uVar5,"recv part");
    }
  }
  return uVar5;
}

Assistant:

REF_FCN static REF_STATUS ref_migrate_native_rcb_direction(
    REF_MPI ref_mpi, REF_INT n, REF_DBL *xyz, REF_DBL *transform, REF_INT npart,
    REF_INT offset, REF_INT *owners, REF_INT *locals, REF_MPI global_mpi,
    REF_INT *part, REF_INT seed, REF_INT dir, REF_BOOL twod) {
  REF_INT i, j, n0, n1, npart0, npart1, offset0, offset1;
  REF_INT bal_n0, bal_n1;
  REF_DBL *xyz0, *xyz1, *x;
  REF_DBL *bal_xyz0, *bal_xyz1;
  REF_INT *owners0, *owners1;
  REF_INT *bal_owners0, *bal_owners1;
  REF_INT *locals0, *locals1;
  REF_INT *bal_locals0, *bal_locals1;
  REF_DBL ratio, value0, value1;
  REF_LONG position, total;
  REF_MPI split_mpi;
  REF_INT seed_base = 3;
  REF_DBL ratio_shift, ratio0, ratio1;
  REF_BOOL cycle_dir = REF_FALSE;

  if (0 == npart) return REF_SUCCESS;

  if (1 == npart) {
    REF_INT *my_id, *recv_part, *recv_locals, nrecv;
    ref_malloc_init(my_id, n, REF_INT, offset);
    RSS(ref_mpi_blindsend(global_mpi, owners, my_id, 1, n, (void **)&recv_part,
                          &nrecv, REF_INT_TYPE),
        "recv part");
    RSS(ref_mpi_blindsend(global_mpi, owners, locals, 1, n,
                          (void **)&recv_locals, &nrecv, REF_INT_TYPE),
        "recv loc");
    for (i = 0; i < nrecv; i++) part[recv_locals[i]] = recv_part[i];
    ref_free(recv_part);
    ref_free(recv_locals);
    ref_free(my_id);
    return REF_SUCCESS;
  }

  ref_malloc(x, n, REF_DBL);
  if (dir < 0 || 2 < dir)
    RSS(ref_migrate_split_dir(ref_mpi, n, xyz, transform, &dir), "dir");
  RAS(-1 < dir && dir < 3, "3D dir");
  RSS(ref_migrate_split_ratio(npart, &ratio), "ratio");
  ratio_shift = (REF_DBL)(seed % seed_base) / (REF_DBL)seed_base;
  ratio0 = ratio * ratio_shift;
  ratio1 = 1.0 - (ratio - ratio0);

  for (i = 0; i < n; i++) {
    REF_DBL transformed[3];
    RSS(ref_matrix_ax(3, transform, &(xyz[3 * i]), transformed), "ax");
    x[i] = transformed[dir];
  }

  total = (REF_LONG)n;
  RSS(ref_mpi_allsum(ref_mpi, &total, 1, REF_LONG_TYPE), "high_pos");

  position = (REF_LONG)((REF_DBL)total * ratio0);
  RSS(ref_search_selection(ref_mpi, n, x, position, &value0), "target");
  position = (REF_LONG)((REF_DBL)total * ratio1);
  RSS(ref_search_selection(ref_mpi, n, x, position, &value1), "target");

  ref_malloc(xyz0, 3 * n, REF_DBL);
  ref_malloc(xyz1, 3 * n, REF_DBL);
  ref_malloc(owners0, n, REF_INT);
  ref_malloc(owners1, n, REF_INT);
  ref_malloc(locals0, n, REF_INT);
  ref_malloc(locals1, n, REF_INT);

  n0 = 0;
  n1 = 0;
  for (i = 0; i < n; i++) {
    if (x[i] < value0 || value1 < x[i]) {
      for (j = 0; j < 3; j++) xyz0[j + 3 * n0] = xyz[j + 3 * i];
      owners0[n0] = owners[i];
      locals0[n0] = locals[i];
      n0++;
    } else {
      for (j = 0; j < 3; j++) xyz1[j + 3 * n1] = xyz[j + 3 * i];
      owners1[n1] = owners[i];
      locals1[n1] = locals[i];
      n1++;
    }
  }
  REIS(n, n0 + n1, "conservation");
  npart0 = npart / 2;
  npart1 = npart - npart0;
  offset0 = offset;
  offset1 = offset + npart0;

  RSS(ref_mpi_balance(ref_mpi, 3, n0, (void *)xyz0, 0, npart0 - 1, &bal_n0,
                      (void **)(&bal_xyz0), REF_DBL_TYPE),
      "split 0");
  RSS(ref_mpi_balance(ref_mpi, 3, n1, (void *)xyz1, npart0,
                      ref_mpi_n(ref_mpi) - 1, &bal_n1, (void **)(&bal_xyz1),
                      REF_DBL_TYPE),
      "split 1");

  RSS(ref_mpi_balance(ref_mpi, 1, n0, (void *)owners0, 0, npart0 - 1, &bal_n0,
                      (void **)(&bal_owners0), REF_INT_TYPE),
      "split owner 0");
  RSS(ref_mpi_balance(ref_mpi, 1, n1, (void *)owners1, npart0,
                      ref_mpi_n(ref_mpi) - 1, &bal_n1, (void **)(&bal_owners1),
                      REF_INT_TYPE),
      "split owner 1");

  RSS(ref_mpi_balance(ref_mpi, 1, n0, (void *)locals0, 0, npart0 - 1, &bal_n0,
                      (void **)(&bal_locals0), REF_INT_TYPE),
      "split local 0");
  RSS(ref_mpi_balance(ref_mpi, 1, n1, (void *)locals1, npart0,
                      ref_mpi_n(ref_mpi) - 1, &bal_n1, (void **)(&bal_locals1),
                      REF_INT_TYPE),
      "split local 1");

  RSS(ref_mpi_front_comm(ref_mpi, &split_mpi, npart0), "split");

  if (cycle_dir) {
    dir += 1;
    if (dir > 2) dir -= 3;
    if (twod && dir > 1) dir -= 2; /* twod skips Z */
  } else {
    dir = -1; /* direction computed in next recursion */
  }
  if (ref_mpi_rank(ref_mpi) < npart0) {
    RSS(ref_migrate_native_rcb_direction(
            split_mpi, bal_n0, bal_xyz0, transform, npart0, offset0,
            bal_owners0, bal_locals0, global_mpi, part, seed, dir, twod),
        "recurse 0");
  } else {
    RSS(ref_migrate_native_rcb_direction(
            split_mpi, bal_n1, bal_xyz1, transform, npart1, offset1,
            bal_owners1, bal_locals1, global_mpi, part, seed, dir, twod),
        "recurse 1");
  }

  RSS(ref_mpi_join_comm(split_mpi), "join");
  RSS(ref_mpi_free(split_mpi), "new free");

  ref_free(bal_locals1);
  ref_free(bal_locals0);

  ref_free(bal_owners1);
  ref_free(bal_owners0);

  ref_free(bal_xyz1);
  ref_free(bal_xyz0);

  ref_free(locals1);
  ref_free(locals0);

  ref_free(owners1);
  ref_free(owners0);

  ref_free(xyz1);
  ref_free(xyz0);

  ref_free(x);
  return REF_SUCCESS;
}